

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_statement.cpp
# Opt level: O2

string * __thiscall
duckdb::ResetVariableStatement::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ResetVariableStatement *this)

{
  SetScope scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_4b0ffdd + 9,(allocator *)&local_50);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ScopeToString_abi_cxx11_(&local_30,(duckdb *)(ulong)(this->super_SetStatement).scope,scope);
  ::std::operator+(&local_50," ",&local_30);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::operator+(&local_50," ",&(this->super_SetStatement).name);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string ResetVariableStatement::ToString() const {
	string result = "";
	result += "RESET";
	result += " " + ScopeToString(scope);
	result += " " + name;
	result += ";";
	return result;
}